

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int client_ech_select_hello(ptls_t *tls,ptls_iovec_t message,size_t confirm_hash_off,char *label)

{
  uint8_t *puVar1;
  ptls_key_schedule_t *ppVar2;
  st_ptls_hash_context_t *psVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  void *get_sni_arg;
  int includes_appdata;
  uint8_t *puVar8;
  uint8_t confirm_hash_expected [8];
  uint8_t confirm_hash_delivered [8];
  
  puVar8 = message.base;
  if (confirm_hash_off != 0) {
    confirm_hash_delivered = *(uint8_t (*) [8])(puVar8 + confirm_hash_off);
    puVar1 = puVar8 + confirm_hash_off;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    iVar4 = ech_calc_confirmation
                      (tls->key_schedule,confirm_hash_expected,(tls->ech).inner_client_random,label,
                       message);
    if (iVar4 != 0) goto LAB_0010fec4;
    iVar4 = (*ptls_mem_equal)(confirm_hash_delivered,confirm_hash_expected,8);
    *(byte *)&tls->ech = *(byte *)&tls->ech & 0xfb | ((byte)iVar4 & 1) << 2;
    *(uint8_t (*) [8])(puVar8 + confirm_hash_off) = confirm_hash_delivered;
    iVar4 = 0;
    if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x4) !=
        (undefined1  [112])0x0) goto LAB_0010fec4;
  }
  ptls_aead_free((tls->ech).aead);
  (tls->ech).aead = (ptls_aead_context_t *)0x0;
  ppVar2 = tls->key_schedule;
  if (ppVar2->generation != 1) {
    __assert_fail("sched->generation == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x564,"void key_schedule_select_outer(ptls_key_schedule_t *)");
  }
  if (ppVar2->num_hashes != 1) {
    __assert_fail("sched->num_hashes == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x565,"void key_schedule_select_outer(ptls_key_schedule_t *)");
  }
  if (ppVar2->hashes[0].ctx_outer == (ptls_hash_context_t *)0x0) {
    __assert_fail("sched->hashes[0].ctx_outer != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x566,"void key_schedule_select_outer(ptls_key_schedule_t *)");
  }
  psVar3 = ppVar2->hashes[0].ctx;
  iVar4 = 0;
  (*psVar3->final)(psVar3,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
  ppVar2->hashes[0].ctx = ppVar2->hashes[0].ctx_outer;
  ppVar2->hashes[0].ctx_outer = (ptls_hash_context_t *)0x0;
LAB_0010fec4:
  uVar5 = ptls_log_point_maybe_active(&client_ech_select_hello::logpoint);
  if (uVar5 != 0) {
    uVar6 = ptls_log_conn_maybe_active(&tls->log_state,(_func_char_ptr_void_ptr *)tls,get_sni_arg);
    if ((uVar6 & uVar5) != 0) {
      includes_appdata = 0;
      do {
        ptls_log__do_write_start(&client_ech_select_hello::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
        ptls_log__do_push_element_bool(",\"is_ech\":",10,*(uint *)&tls->ech >> 2 & 1);
        iVar7 = ptls_log__do_write_end
                          (&client_ech_select_hello::logpoint,&tls->log_state,ptls_get_server_name,
                           tls,includes_appdata);
        includes_appdata = 1;
      } while (iVar7 != 0);
    }
  }
  (*ptls_clear_memory)(confirm_hash_expected,8);
  return iVar4;
}

Assistant:

static int client_ech_select_hello(ptls_t *tls, ptls_iovec_t message, size_t confirm_hash_off, const char *label)
{
    uint8_t confirm_hash_delivered[PTLS_ECH_CONFIRM_LENGTH], confirm_hash_expected[PTLS_ECH_CONFIRM_LENGTH];
    int ret = 0;

    /* Determine if ECH has been accepted by checking the confirmation hash. `confirm_hash_off` set to zero indicates that HRR was
     * received wo. ECH extension, which is an indication that ECH was rejected. */
    if (confirm_hash_off != 0) {
        memcpy(confirm_hash_delivered, message.base + confirm_hash_off, sizeof(confirm_hash_delivered));
        memset(message.base + confirm_hash_off, 0, sizeof(confirm_hash_delivered));
        if ((ret = ech_calc_confirmation(tls->key_schedule, confirm_hash_expected, tls->ech.inner_client_random, label, message)) !=
            0)
            goto Exit;
        tls->ech.accepted = ptls_mem_equal(confirm_hash_delivered, confirm_hash_expected, sizeof(confirm_hash_delivered));
        memcpy(message.base + confirm_hash_off, confirm_hash_delivered, sizeof(confirm_hash_delivered));
        if (tls->ech.accepted)
            goto Exit;
    }

    /* dispose ECH AEAD state to indicate rejection, adopting outer CH for the rest of the handshake */
    ptls_aead_free(tls->ech.aead);
    tls->ech.aead = NULL;
    key_schedule_select_outer(tls->key_schedule);

Exit:
    PTLS_PROBE(ECH_SELECTION, tls, !!tls->ech.accepted);
    PTLS_LOG_CONN(ech_selection, tls, { PTLS_LOG_ELEMENT_BOOL(is_ech, tls->ech.accepted); });
    ptls_clear_memory(confirm_hash_expected, sizeof(confirm_hash_expected));
    return ret;
}